

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O2

void I422AlphaToARGBRow_SSSE3
               (uint8_t *y_buf,uint8_t *u_buf,uint8_t *v_buf,uint8_t *a_buf,uint8_t *dst_argb,
               YuvConstants *yuvconstants,int width)

{
  ulong uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined4 uVar7;
  undefined4 uVar8;
  bool bVar9;
  char cVar10;
  char cVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  short sVar24;
  short sVar25;
  short sVar26;
  short sVar27;
  short sVar28;
  short sVar29;
  short sVar30;
  short sVar31;
  short sVar32;
  short sVar33;
  short sVar34;
  short sVar35;
  short sVar36;
  short sVar37;
  short sVar38;
  short sVar39;
  short sVar40;
  short sVar41;
  short sVar42;
  short sVar43;
  short sVar44;
  short sVar45;
  short sVar46;
  short sVar47;
  short sVar48;
  short sVar49;
  short sVar50;
  short sVar51;
  short sVar52;
  short sVar53;
  short sVar54;
  short sVar55;
  short sVar56;
  short sVar57;
  short sVar58;
  undefined6 uVar59;
  undefined1 auVar60 [14];
  undefined1 auVar61 [12];
  unkbyte10 Var62;
  undefined1 auVar63 [14];
  undefined1 auVar64 [12];
  unkbyte10 Var65;
  unkbyte9 Var66;
  unkbyte9 Var67;
  undefined6 uVar68;
  undefined2 uVar69;
  int iVar70;
  long lVar71;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar92 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined2 uVar79;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 uVar93;
  
  auVar3 = *(undefined1 (*) [16])yuvconstants->kUVToB;
  auVar4 = *(undefined1 (*) [16])yuvconstants->kUVToG;
  auVar5 = *(undefined1 (*) [16])yuvconstants->kUVToR;
  sVar35 = yuvconstants->kUVBiasB[0];
  sVar36 = yuvconstants->kUVBiasB[1];
  sVar37 = yuvconstants->kUVBiasB[2];
  sVar38 = yuvconstants->kUVBiasB[3];
  sVar39 = yuvconstants->kUVBiasB[4];
  sVar40 = yuvconstants->kUVBiasB[5];
  sVar41 = yuvconstants->kUVBiasB[6];
  sVar42 = yuvconstants->kUVBiasB[7];
  sVar43 = yuvconstants->kUVBiasG[0];
  sVar44 = yuvconstants->kUVBiasG[1];
  sVar45 = yuvconstants->kUVBiasG[2];
  sVar46 = yuvconstants->kUVBiasG[3];
  sVar47 = yuvconstants->kUVBiasG[4];
  sVar48 = yuvconstants->kUVBiasG[5];
  sVar49 = yuvconstants->kUVBiasG[6];
  sVar50 = yuvconstants->kUVBiasG[7];
  sVar51 = yuvconstants->kUVBiasR[0];
  sVar52 = yuvconstants->kUVBiasR[1];
  sVar53 = yuvconstants->kUVBiasR[2];
  sVar54 = yuvconstants->kUVBiasR[3];
  sVar55 = yuvconstants->kUVBiasR[4];
  sVar56 = yuvconstants->kUVBiasR[5];
  sVar57 = yuvconstants->kUVBiasR[6];
  sVar58 = yuvconstants->kUVBiasR[7];
  auVar6 = *(undefined1 (*) [16])yuvconstants->kYToRgb;
  lVar71 = (long)v_buf - (long)u_buf;
  do {
    uVar7 = *(undefined4 *)u_buf;
    uVar8 = *(undefined4 *)(u_buf + lVar71);
    u_buf = u_buf + 4;
    uVar79 = CONCAT11((char)((uint)uVar8 >> 0x18),(char)((uint)uVar7 >> 0x18));
    uVar2 = CONCAT35(CONCAT21(uVar79,(char)((uint)uVar8 >> 0x10)),
                     CONCAT14((char)((uint)uVar7 >> 0x10),uVar7));
    uVar59 = CONCAT51(CONCAT41((int)((ulong)uVar2 >> 0x20),(char)((uint)uVar8 >> 8)),
                      (char)((uint)uVar7 >> 8));
    auVar83._0_2_ = CONCAT11((char)uVar8,(char)uVar7);
    uVar1 = CONCAT62(uVar59,auVar83._0_2_);
    auVar72._8_4_ = 0;
    auVar72._0_8_ = uVar1;
    auVar72._12_2_ = uVar79;
    auVar72._14_2_ = uVar79;
    uVar79 = (undefined2)((ulong)uVar2 >> 0x20);
    auVar92._12_4_ = auVar72._12_4_;
    auVar92._8_2_ = 0;
    auVar92._0_8_ = uVar1;
    auVar92._10_2_ = uVar79;
    auVar80._10_6_ = auVar92._10_6_;
    auVar80._8_2_ = uVar79;
    auVar80._0_8_ = uVar1;
    uVar79 = (undefined2)uVar59;
    auVar83._8_8_ = auVar80._8_8_;
    auVar83._6_2_ = uVar79;
    auVar83._4_2_ = uVar79;
    auVar83._2_2_ = auVar83._0_2_;
    uVar1 = *(ulong *)y_buf;
    uVar93 = (undefined1)(uVar1 >> 0x38);
    auVar91._8_6_ = 0;
    auVar91._0_8_ = uVar1;
    auVar91[0xe] = uVar93;
    auVar91[0xf] = uVar93;
    uVar93 = (undefined1)(uVar1 >> 0x30);
    auVar90._14_2_ = auVar91._14_2_;
    auVar90._8_5_ = 0;
    auVar90._0_8_ = uVar1;
    auVar90[0xd] = uVar93;
    auVar89._13_3_ = auVar90._13_3_;
    auVar89._8_4_ = 0;
    auVar89._0_8_ = uVar1;
    auVar89[0xc] = uVar93;
    uVar93 = (undefined1)(uVar1 >> 0x28);
    auVar88._12_4_ = auVar89._12_4_;
    auVar88._8_3_ = 0;
    auVar88._0_8_ = uVar1;
    auVar88[0xb] = uVar93;
    auVar87._11_5_ = auVar88._11_5_;
    auVar87._8_2_ = 0;
    auVar87._0_8_ = uVar1;
    auVar87[10] = uVar93;
    uVar93 = (undefined1)(uVar1 >> 0x20);
    auVar86._10_6_ = auVar87._10_6_;
    auVar86[8] = 0;
    auVar86._0_8_ = uVar1;
    auVar86[9] = uVar93;
    auVar85._9_7_ = auVar86._9_7_;
    auVar85[8] = uVar93;
    auVar85._0_8_ = uVar1;
    uVar93 = (undefined1)(uVar1 >> 0x18);
    auVar84._8_8_ = auVar85._8_8_;
    auVar84[7] = uVar93;
    auVar84[6] = uVar93;
    uVar93 = (undefined1)(uVar1 >> 0x10);
    auVar84[5] = uVar93;
    auVar84[4] = uVar93;
    uVar93 = (undefined1)(uVar1 >> 8);
    auVar84[3] = uVar93;
    auVar84[2] = uVar93;
    auVar84[0] = (undefined1)uVar1;
    auVar84[1] = auVar84[0];
    y_buf = (uint8_t *)((long)y_buf + 8);
    uVar2 = *(undefined8 *)a_buf;
    a_buf = a_buf + 8;
    auVar80 = pmaddubsw(auVar83,auVar3);
    auVar73._0_2_ = sVar35 - auVar80._0_2_;
    auVar73._2_2_ = sVar36 - auVar80._2_2_;
    auVar73._4_2_ = sVar37 - auVar80._4_2_;
    auVar73._6_2_ = sVar38 - auVar80._6_2_;
    auVar73._8_2_ = sVar39 - auVar80._8_2_;
    auVar73._10_2_ = sVar40 - auVar80._10_2_;
    auVar73._12_2_ = sVar41 - auVar80._12_2_;
    auVar73._14_2_ = sVar42 - auVar80._14_2_;
    auVar80 = pmaddubsw(auVar83,auVar4);
    auVar81._0_2_ = sVar43 - auVar80._0_2_;
    auVar81._2_2_ = sVar44 - auVar80._2_2_;
    auVar81._4_2_ = sVar45 - auVar80._4_2_;
    auVar81._6_2_ = sVar46 - auVar80._6_2_;
    auVar81._8_2_ = sVar47 - auVar80._8_2_;
    auVar81._10_2_ = sVar48 - auVar80._10_2_;
    auVar81._12_2_ = sVar49 - auVar80._12_2_;
    auVar81._14_2_ = sVar50 - auVar80._14_2_;
    auVar83 = pmaddubsw(auVar83,auVar5);
    auVar82._0_2_ = sVar51 - auVar83._0_2_;
    auVar82._2_2_ = sVar52 - auVar83._2_2_;
    auVar82._4_2_ = sVar53 - auVar83._4_2_;
    auVar82._6_2_ = sVar54 - auVar83._6_2_;
    auVar82._8_2_ = sVar55 - auVar83._8_2_;
    auVar82._10_2_ = sVar56 - auVar83._10_2_;
    auVar82._12_2_ = sVar57 - auVar83._12_2_;
    auVar82._14_2_ = sVar58 - auVar83._14_2_;
    auVar92 = pmulhuw(auVar84,auVar6);
    auVar83 = paddsw(auVar73,auVar92);
    auVar80 = paddsw(auVar81,auVar92);
    auVar92 = paddsw(auVar82,auVar92);
    auVar83 = psraw(auVar83,6);
    auVar80 = psraw(auVar80,6);
    auVar92 = psraw(auVar92,6);
    sVar12 = auVar83._0_2_;
    sVar14 = auVar83._2_2_;
    sVar17 = auVar83._4_2_;
    sVar20 = auVar83._6_2_;
    sVar23 = auVar83._8_2_;
    sVar26 = auVar83._10_2_;
    sVar29 = auVar83._12_2_;
    sVar32 = auVar83._14_2_;
    cVar10 = (0 < sVar32) * (sVar32 < 0x100) * auVar83[0xe] - (0xff < sVar32);
    sVar32 = auVar80._0_2_;
    sVar15 = auVar80._2_2_;
    sVar18 = auVar80._4_2_;
    sVar21 = auVar80._6_2_;
    sVar24 = auVar80._8_2_;
    sVar27 = auVar80._10_2_;
    sVar30 = auVar80._12_2_;
    sVar33 = auVar80._14_2_;
    sVar13 = auVar92._0_2_;
    sVar16 = auVar92._2_2_;
    sVar19 = auVar92._4_2_;
    sVar22 = auVar92._6_2_;
    sVar25 = auVar92._8_2_;
    sVar28 = auVar92._10_2_;
    sVar31 = auVar92._12_2_;
    sVar34 = auVar92._14_2_;
    cVar11 = (0 < sVar34) * (sVar34 < 0x100) * auVar92[0xe] - (0xff < sVar34);
    uVar79 = CONCAT11((0 < sVar33) * (sVar33 < 0x100) * auVar80[0xe] - (0xff < sVar33),cVar10);
    uVar7 = CONCAT31(CONCAT21(uVar79,(0 < sVar30) * (sVar30 < 0x100) * auVar80[0xc] -
                                     (0xff < sVar30)),
                     (0 < sVar29) * (sVar29 < 0x100) * auVar83[0xc] - (0xff < sVar29));
    uVar59 = CONCAT51(CONCAT41(uVar7,(0 < sVar27) * (sVar27 < 0x100) * auVar80[10] - (0xff < sVar27)
                              ),(0 < sVar26) * (sVar26 < 0x100) * auVar83[10] - (0xff < sVar26));
    Var66 = CONCAT72(CONCAT61(uVar59,(0 < sVar24) * (sVar24 < 0x100) * auVar80[8] - (0xff < sVar24))
                     ,CONCAT11((0 < sVar23) * (sVar23 < 0x100) * auVar83[8] - (0xff < sVar23),cVar10
                              ));
    Var62 = CONCAT91(CONCAT81((long)((unkuint9)Var66 >> 8),
                              (0 < sVar21) * (sVar21 < 0x100) * auVar80[6] - (0xff < sVar21)),
                     (0 < sVar20) * (sVar20 < 0x100) * auVar83[6] - (0xff < sVar20));
    auVar61._2_10_ = Var62;
    auVar61[1] = (0 < sVar18) * (sVar18 < 0x100) * auVar80[4] - (0xff < sVar18);
    auVar61[0] = (0 < sVar17) * (sVar17 < 0x100) * auVar83[4] - (0xff < sVar17);
    auVar60._2_12_ = auVar61;
    auVar60[1] = (0 < sVar15) * (sVar15 < 0x100) * auVar80[2] - (0xff < sVar15);
    auVar60[0] = (0 < sVar14) * (sVar14 < 0x100) * auVar83[2] - (0xff < sVar14);
    auVar74._0_2_ =
         CONCAT11((0 < sVar32) * (sVar32 < 0x100) * auVar80[0] - (0xff < sVar32),
                  (0 < sVar12) * (sVar12 < 0x100) * auVar83[0] - (0xff < sVar12));
    auVar74._2_14_ = auVar60;
    uVar69 = CONCAT11((char)((ulong)uVar2 >> 0x38),cVar11);
    uVar8 = CONCAT31(CONCAT21(uVar69,(char)((ulong)uVar2 >> 0x30)),
                     (0 < sVar31) * (sVar31 < 0x100) * auVar92[0xc] - (0xff < sVar31));
    uVar68 = CONCAT51(CONCAT41(uVar8,(char)((ulong)uVar2 >> 0x28)),
                      (0 < sVar28) * (sVar28 < 0x100) * auVar92[10] - (0xff < sVar28));
    Var67 = CONCAT72(CONCAT61(uVar68,(char)((ulong)uVar2 >> 0x20)),
                     CONCAT11((0 < sVar25) * (sVar25 < 0x100) * auVar92[8] - (0xff < sVar25),cVar11)
                    );
    Var65 = CONCAT91(CONCAT81((long)((unkuint9)Var67 >> 8),(char)((ulong)uVar2 >> 0x18)),
                     (0 < sVar22) * (sVar22 < 0x100) * auVar92[6] - (0xff < sVar22));
    auVar64._2_10_ = Var65;
    auVar64[1] = (char)((ulong)uVar2 >> 0x10);
    auVar64[0] = (0 < sVar19) * (sVar19 < 0x100) * auVar92[4] - (0xff < sVar19);
    auVar63._2_12_ = auVar64;
    auVar63[1] = (char)((ulong)uVar2 >> 8);
    auVar63[0] = (0 < sVar16) * (sVar16 < 0x100) * auVar92[2] - (0xff < sVar16);
    auVar75[3] = (char)uVar2;
    auVar75[2] = (0 < sVar13) * (sVar13 < 0x100) * auVar92[0] - (0xff < sVar13);
    auVar78._0_12_ = auVar74._0_12_;
    auVar78._12_2_ = (short)Var62;
    auVar78._14_2_ = (short)Var65;
    auVar77._12_4_ = auVar78._12_4_;
    auVar77._0_10_ = auVar74._0_10_;
    auVar77._10_2_ = auVar64._0_2_;
    auVar76._10_6_ = auVar77._10_6_;
    auVar76._0_8_ = auVar74._0_8_;
    auVar76._8_2_ = auVar61._0_2_;
    auVar75._8_8_ = auVar76._8_8_;
    auVar75._6_2_ = auVar63._0_2_;
    auVar75._4_2_ = auVar60._0_2_;
    auVar75._0_2_ = auVar74._0_2_;
    *(undefined1 (*) [16])dst_argb = auVar75;
    *(short *)*(undefined1 (*) [16])((long)dst_argb + 0x10) = (short)((unkuint9)Var66 >> 8);
    *(short *)(*(undefined1 (*) [16])((long)dst_argb + 0x10) + 2) = (short)((unkuint9)Var67 >> 8);
    *(short *)(*(undefined1 (*) [16])((long)dst_argb + 0x10) + 4) = (short)uVar59;
    *(short *)(*(undefined1 (*) [16])((long)dst_argb + 0x10) + 6) = (short)uVar68;
    *(short *)(*(undefined1 (*) [16])((long)dst_argb + 0x10) + 8) = (short)uVar7;
    *(short *)(*(undefined1 (*) [16])((long)dst_argb + 0x10) + 10) = (short)uVar8;
    *(undefined2 *)(*(undefined1 (*) [16])((long)dst_argb + 0x10) + 0xc) = uVar79;
    *(undefined2 *)(*(undefined1 (*) [16])((long)dst_argb + 0x10) + 0xe) = uVar69;
    dst_argb = (uint8_t *)((long)dst_argb + 0x20);
    iVar70 = width + -8;
    bVar9 = 7 < width;
    width = iVar70;
  } while (iVar70 != 0 && bVar9);
  return;
}

Assistant:

void OMITFP I422AlphaToARGBRow_SSSE3(const uint8_t* y_buf,
                                     const uint8_t* u_buf,
                                     const uint8_t* v_buf,
                                     const uint8_t* a_buf,
                                     uint8_t* dst_argb,
                                     const struct YuvConstants* yuvconstants,
                                     int width) {
  // clang-format off
  asm volatile (
    YUVTORGB_SETUP(yuvconstants)
      "sub         %[u_buf],%[v_buf]             \n"

    LABELALIGN
      "1:                                        \n"
    READYUVA422
    YUVTORGB(yuvconstants)
    STOREARGB
      "subl        $0x8,%[width]                 \n"
      "jg          1b                            \n"
  : [y_buf]"+r"(y_buf),    // %[y_buf]
    [u_buf]"+r"(u_buf),    // %[u_buf]
    [v_buf]"+r"(v_buf),    // %[v_buf]
    [a_buf]"+r"(a_buf),    // %[a_buf]
    [dst_argb]"+r"(dst_argb),  // %[dst_argb]
#if defined(__i386__)
    [width]"+m"(width)     // %[width]
#else
    [width]"+rm"(width)    // %[width]
#endif
  : [yuvconstants]"r"(yuvconstants)  // %[yuvconstants]
  : "memory", "cc", YUVTORGB_REGS
    "xmm0", "xmm1", "xmm2", "xmm3", "xmm4", "xmm5"
  );
  // clang-format on
}